

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O1

void uv__fs_work(uv__work *w)

{
  uv_loop_s **buf;
  int iVar1;
  uv__work *ptr;
  iovec *__iovec;
  uv__queue *puVar2;
  bool bVar3;
  __mode_t __mode;
  _func_void_uv__work_ptr_int *p_Var4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uv_dirent_type_t uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint *puVar13;
  uv__queue *puVar14;
  void *pvVar15;
  size_t sVar16;
  _func_void_uv__work_ptr *p_Var17;
  ssize_t sVar18;
  size_t sVar19;
  size_t sVar20;
  uv__queue *puVar21;
  dirent64 *dent;
  char *pcVar22;
  DIR *pDVar23;
  ssize_t sVar24;
  _func_void_uv__work_ptr *p_Var25;
  long lVar26;
  code *pcVar27;
  _func_void_uv__work_ptr_int *p_Var28;
  uv__queue *puVar29;
  ulong uVar30;
  size_t sVar31;
  pollfd pfd;
  statfs s;
  _func_void_uv__work_ptr_int *local_2188;
  stat64 local_2158;
  stat64 local_20c8;
  undefined1 local_2038 [16];
  uv__queue *local_2028;
  void *local_2020;
  uint local_2018;
  int iStack_2014;
  uv_loop_s *local_2010;
  uv__queue *local_2008;
  __fsid_t local_2000;
  uv_fs_type local_1ff8;
  undefined4 uStack_1ff4;
  uv_loop_t *local_1ff0;
  uv_fs_cb p_Stack_1fe8;
  _func_void_uv__work_ptr_int *local_1fe0;
  uv_loop_s *puStack_1fd8;
  uv__queue *local_1fd0;
  uv__queue *local_1fc8;
  char *local_1f28;
  int local_1f20;
  uint local_1f1c;
  uv_buf_t *local_1f10;
  _func_void_uv__work_ptr_int *local_1f08;
  uv__work local_1ee8;
  size_t local_1eb8;
  
  iVar1 = *(int *)&w[-7].done;
  puVar13 = (uint *)__errno_location();
  buf = &w[-6].loop;
  do {
    *puVar13 = 0;
    switch(*(undefined4 *)&w[-7].done) {
    case 1:
      iVar5 = open64((char *)w[-6].done,*(uint *)((long)&w[-2].wq.next + 4) | 0x80000,
                     (ulong)*(uint *)&w[-2].wq.prev);
      break;
    case 2:
      iVar5 = uv__close_nocancel(*(int *)&w[-2].wq.next);
      if (iVar5 == -1) {
        iVar5 = -(uint)(*puVar13 != 0x73 && *puVar13 != 4);
      }
      break;
    case 3:
      uVar9 = uv__getiovmax();
      if (uVar9 < *(uint *)((long)&w[-2].wq.prev + 4)) {
        *(uint *)((long)&w[-2].wq.prev + 4) = uVar9;
      }
      p_Var28 = w[-1].done;
      iVar5 = *(int *)((long)&w[-2].wq.prev + 4);
      if ((long)p_Var28 < 0) {
        if (iVar5 == 1) {
          puVar14 = (uv__queue *)
                    read(*(int *)&w[-2].wq.next,*(void **)w[-1].work,*(size_t *)(w[-1].work + 8));
        }
        else {
          puVar14 = (uv__queue *)readv(*(int *)&w[-2].wq.next,(iovec *)w[-1].work,iVar5);
        }
      }
      else if (iVar5 == 1) {
        puVar14 = (uv__queue *)
                  pread64(*(int *)&w[-2].wq.next,*(void **)w[-1].work,*(size_t *)(w[-1].work + 8),
                          (__off64_t)p_Var28);
      }
      else {
        if (uv__fs_read_no_preadv == 0) {
          puVar14 = (uv__queue *)
                    preadv64(*(int *)&w[-2].wq.next,(iovec *)w[-1].work,iVar5,(__off64_t)p_Var28);
          if ((puVar14 != (uv__queue *)0xffffffffffffffff) ||
             (puVar14 = (uv__queue *)0xffffffffffffffff, *puVar13 != 0x26)) goto LAB_00152cf4;
          uv__fs_read_no_preadv = 1;
        }
        uVar30 = (ulong)*(uint *)((long)&w[-2].wq.prev + 4);
        if (uVar30 == 0) {
          __assert_fail("nbufs > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/fs.c"
                        ,0x1a8,"ssize_t uv__fs_preadv(uv_file, uv_buf_t *, unsigned int, off_t)");
        }
        iVar5 = *(int *)&w[-2].wq.next;
        p_Var28 = w[-1].done;
        p_Var17 = w[-1].work;
        p_Var25 = p_Var17 + uVar30 * 0x10;
        puVar14 = (uv__queue *)0x0;
        do {
          uVar30 = 0;
          do {
            do {
              sVar18 = pread64(iVar5,(void *)(*(long *)p_Var17 + uVar30),
                               *(long *)(p_Var17 + 8) - uVar30,(__off64_t)(p_Var28 + (long)puVar14))
              ;
              if (sVar18 != -1) break;
            } while (*puVar13 == 4);
            if (sVar18 == 0) goto LAB_00152cf4;
            if (sVar18 == -1 && puVar14 == (uv__queue *)0x0) {
              puVar14 = (uv__queue *)-(long)(int)*puVar13;
              goto LAB_00152cf4;
            }
            if (sVar18 == -1) goto LAB_00152cf4;
            uVar30 = uVar30 + sVar18;
            puVar14 = (uv__queue *)((long)&puVar14->next + sVar18);
          } while (uVar30 < *(ulong *)(p_Var17 + 8));
          p_Var17 = p_Var17 + 0x10;
        } while (p_Var17 != p_Var25);
      }
LAB_00152cf4:
      if ((uv__work *)w[-1].work != w + 1) {
        uv__free((uv__work *)w[-1].work);
      }
      w[-1].work = (_func_void_uv__work_ptr *)0x0;
      *(undefined4 *)((long)&w[-2].wq.prev + 4) = 0;
      goto LAB_00152d1c;
    case 4:
      uVar6 = uv__getiovmax();
      uVar9 = *(uint *)((long)&w[-2].wq.prev + 4);
      ptr = (uv__work *)w[-1].work;
      if (uVar9 == 0) {
        puVar14 = (uv__queue *)0x0;
      }
      else {
        puVar14 = (uv__queue *)0x0;
        do {
          uVar7 = uVar6;
          if (uVar9 < uVar6) {
            uVar7 = uVar9;
          }
          *(uint *)((long)&w[-2].wq.prev + 4) = uVar7;
          do {
            p_Var28 = w[-1].done;
            iVar5 = *(int *)((long)&w[-2].wq.prev + 4);
            if ((long)p_Var28 < 0) {
              iVar11 = *(int *)&w[-2].wq.next;
              __iovec = (iovec *)w[-1].work;
              if (iVar5 == 1) {
                puVar21 = (uv__queue *)write(iVar11,__iovec->iov_base,__iovec->iov_len);
              }
              else {
                puVar21 = (uv__queue *)writev(iVar11,__iovec,iVar5);
              }
            }
            else {
              if (iVar5 == 1) {
                iVar5 = *(int *)&w[-2].wq.next;
                pvVar15 = *(void **)w[-1].work;
                sVar16 = *(size_t *)(w[-1].work + 8);
              }
              else {
                if (uv__fs_write_no_pwritev == 0) {
                  puVar21 = (uv__queue *)
                            pwritev64(*(int *)&w[-2].wq.next,(iovec *)w[-1].work,iVar5,
                                      (__off64_t)p_Var28);
                  if ((puVar21 != (uv__queue *)0xffffffffffffffff) ||
                     (puVar21 = (uv__queue *)0xffffffffffffffff, *puVar13 != 0x26))
                  goto LAB_00152099;
                  uv__fs_write_no_pwritev = 1;
                }
                iVar5 = *(int *)&w[-2].wq.next;
                pvVar15 = *(void **)w[-1].work;
                sVar16 = *(size_t *)(w[-1].work + 8);
                p_Var28 = w[-1].done;
              }
              puVar21 = (uv__queue *)pwrite64(iVar5,pvVar15,sVar16,(__off64_t)p_Var28);
            }
LAB_00152099:
          } while (((long)puVar21 < 0) && (*puVar13 == 4));
          if ((long)puVar21 < 1) {
            if (puVar14 == (uv__queue *)0x0) {
              puVar14 = puVar21;
            }
            break;
          }
          if (-1 < (long)w[-1].done) {
            w[-1].done = w[-1].done + (long)puVar21;
          }
          pcVar27 = w[-1].work + 8;
          uVar7 = 0;
          puVar29 = puVar21;
          do {
            puVar2 = *(uv__queue **)pcVar27;
            if (puVar29 < puVar2) {
              *(code **)(pcVar27 + -8) = (code *)((long)&puVar29->next + *(ulong *)(pcVar27 + -8));
              *(ulong *)pcVar27 = *(ulong *)pcVar27 - (long)puVar29;
              break;
            }
            uVar7 = uVar7 + 1;
            pcVar27 = pcVar27 + 0x10;
            puVar29 = (uv__queue *)((long)puVar29 - (long)puVar2);
          } while (puVar29 != (uv__queue *)0x0);
          *(uint *)((long)&w[-2].wq.prev + 4) = uVar7;
          w[-1].work = w[-1].work + (ulong)uVar7 * 0x10;
          puVar14 = (uv__queue *)((long)&puVar14->next + (long)puVar21);
          uVar9 = uVar9 - uVar7;
        } while (uVar9 != 0);
      }
      if (ptr != w + 1) {
        uv__free(ptr);
      }
      w[-1].work = (_func_void_uv__work_ptr *)0x0;
      *(undefined4 *)((long)&w[-2].wq.prev + 4) = 0;
      goto LAB_00152d1c;
    case 5:
      iVar5 = *(int *)&w[-2].wq.next;
      iVar11 = *(int *)((long)&w[-2].wq.next + 4);
      local_2158.st_dev = (__dev_t)w[-1].done;
      p_Var28 = w[1].done;
      if (uv__fs_try_copy_file_range_no_copy_file_range_support != 0) goto LAB_00151bd6;
      sVar24 = uv__fs_copy_file_range
                         (iVar11,(off_t_conflict *)&local_2158,iVar5,(off_t_conflict *)0x0,
                          (size_t)p_Var28,0);
      if (sVar24 == -1) {
        uVar9 = *puVar13;
        if ((int)uVar9 < 0x12) {
          if (uVar9 == 1) {
            iVar10 = uv__is_cifs_or_smb(iVar5);
            if (iVar10 != 0) goto LAB_00151bd6;
          }
          else if ((((uVar9 == 0xd) &&
                    (iVar10 = fstatfs64(iVar11,(statfs64 *)local_2038), iVar10 != -1)) &&
                   ((uv_loop_s *)local_2038._0_8_ == (uv_loop_s *)0xc36400)) &&
                  (uVar9 = uv__kernel_version(), uVar9 < 0x41400)) {
LAB_00151bd6:
            *puVar13 = 0x26;
          }
        }
        else {
          if (uVar9 == 0x12) goto LAB_00151bd6;
          if (uVar9 == 0x26) {
            uv__fs_try_copy_file_range_no_copy_file_range_support = 1;
          }
          else if (uVar9 == 0x5f) goto LAB_00151bd6;
        }
        if (((*puVar13 != 0x26) ||
            (sVar18 = sendfile64(iVar5,iVar11,(__off64_t *)&local_2158,(size_t)p_Var28),
            sVar18 == -1)) && ((long)local_2158.st_dev <= (long)w[-1].done)) {
          uVar9 = *puVar13;
          if (((uVar9 < 0x17) && ((0x440020U >> (uVar9 & 0x1f) & 1) != 0)) ||
             (puVar14 = (uv__queue *)0xffffffffffffffff, uVar9 == 0x58)) {
            *puVar13 = 0;
            puVar21 = (uv__queue *)w[1].done;
            local_2188 = w[-1].done;
            if (puVar21 == (uv__queue *)0x0) {
              puVar14 = (uv__queue *)0x0;
            }
            else {
              iVar5 = *(int *)&w[-2].wq.next;
              iVar11 = *(int *)((long)&w[-2].wq.next + 4);
              bVar3 = true;
              puVar29 = (uv__queue *)0x0;
              do {
                while( true ) {
                  puVar14 = puVar29;
                  sVar16 = (long)puVar21 - (long)puVar14;
                  if (0x1fff < sVar16) {
                    sVar16 = 0x2000;
                  }
                  do {
                    if (bVar3) {
                      sVar19 = pread64(iVar11,local_2038,sVar16,(__off64_t)local_2188);
                    }
                    else {
                      sVar19 = read(iVar11,local_2038,sVar16);
                    }
                  } while ((sVar19 == 0xffffffffffffffff) && (*puVar13 == 4));
                  if (sVar19 == 0) goto LAB_00152ef5;
                  if (sVar19 == 0xffffffffffffffff) break;
                  if (0 < (long)sVar19) {
                    lVar26 = 0;
                    sVar16 = sVar19;
                    do {
                      while (sVar18 = write(iVar5,local_2038 + lVar26,sVar16), sVar18 == -1) {
                        if (*puVar13 != 4) {
                          if (*puVar13 != 0xb) {
                            puVar14 = (uv__queue *)0xffffffffffffffff;
                            goto LAB_00152ef5;
                          }
                          local_20c8.st_dev._4_2_ = 4;
                          local_20c8.st_dev._6_2_ = 0;
                          local_20c8.st_dev._0_4_ = iVar5;
                          while (iVar10 = poll((pollfd *)&local_20c8,1,-1), iVar10 == -1) {
                            if (*puVar13 != 4) goto LAB_00152de1;
                          }
                          if ((local_20c8.st_dev._6_2_ & 0xfffb) != 0) {
LAB_00152de1:
                            *puVar13 = 5;
                            puVar14 = (uv__queue *)0xffffffffffffffff;
                            goto LAB_00152ef5;
                          }
                        }
                      }
                      lVar26 = lVar26 + sVar18;
                      sVar16 = sVar19 - lVar26;
                    } while (sVar16 != 0 && lVar26 <= (long)sVar19);
                  }
                  local_2188 = local_2188 + sVar19;
                  puVar14 = (uv__queue *)((long)&puVar14->next + sVar19);
                  puVar29 = puVar14;
                  if (puVar21 <= puVar14) goto LAB_00152ef5;
                }
                if ((!bVar3) || (puVar14 != (uv__queue *)0x0)) break;
                bVar3 = false;
                puVar29 = (uv__queue *)0x0;
              } while ((*puVar13 == 5) || (puVar29 = (uv__queue *)0x0, *puVar13 == 0x1d));
              puVar14 = (uv__queue *)((ulong)puVar14 | -(ulong)(puVar14 == (uv__queue *)0x0));
            }
LAB_00152ef5:
            if (puVar14 != (uv__queue *)0xffffffffffffffff) {
              w[-1].done = local_2188;
            }
          }
          goto LAB_00152d1c;
        }
      }
      puVar14 = (uv__queue *)(local_2158.st_dev + -(long)w[-1].done);
      w[-1].done = (_func_void_uv__work_ptr_int *)local_2158.st_dev;
      goto LAB_00152d1c;
    case 6:
      p_Var28 = w[-6].done;
      iVar5 = uv__fs_statx(-1,(char *)p_Var28,0,0,(uv_stat_t *)buf);
      if (iVar5 == -0x26) {
        iVar5 = stat64((char *)p_Var28,(stat64 *)local_2038);
LAB_0015244a:
        if (iVar5 == 0) {
          w[-6].loop = (uv_loop_s *)local_2038._0_8_;
          w[-6].wq.next = (uv__queue *)((ulong)local_2020 & 0xffffffff);
          w[-6].wq.prev = local_2028;
          w[-5].work = (_func_void_uv__work_ptr *)((ulong)local_2020 >> 0x20);
          w[-5].done = (_func_void_uv__work_ptr_int *)(ulong)local_2018;
          w[-5].loop = local_2010;
          w[-5].wq.next = (uv__queue *)local_2038._8_8_;
          w[-5].wq.prev = local_2008;
          w[-4].work = (_func_void_uv__work_ptr *)local_2000.__val;
          w[-4].done = (_func_void_uv__work_ptr_int *)CONCAT44(uStack_1ff4,local_1ff8);
          w[-4].wq.prev = (uv__queue *)local_1ff0;
          w[-3].work = (_func_void_uv__work_ptr *)p_Stack_1fe8;
          w[-3].done = local_1fe0;
          w[-3].loop = puStack_1fd8;
          w[-3].wq.next = local_1fd0;
          w[-3].wq.prev = local_1fc8;
          w[-2].work = (_func_void_uv__work_ptr *)local_1fd0;
          w[-2].done = (_func_void_uv__work_ptr_int *)local_1fc8;
          w[-4].loop = (uv_loop_s *)0x0;
          w[-4].wq.next = (uv__queue *)0x0;
        }
      }
      goto LAB_00152542;
    case 7:
      p_Var28 = w[-6].done;
      iVar5 = uv__fs_statx(-1,(char *)p_Var28,0,1,(uv_stat_t *)buf);
      if (iVar5 == -0x26) {
        iVar5 = lstat64((char *)p_Var28,(stat64 *)local_2038);
        goto LAB_0015244a;
      }
LAB_00152542:
      puVar14 = (uv__queue *)(long)iVar5;
      goto LAB_00152d1c;
    case 8:
      iVar5 = *(int *)&w[-2].wq.next;
      iVar11 = uv__fs_statx(iVar5,"",1,0,(uv_stat_t *)buf);
      if ((iVar11 == -0x26) && (iVar11 = fstat64(iVar5,(stat64 *)local_2038), iVar11 == 0)) {
        w[-6].loop = (uv_loop_s *)local_2038._0_8_;
        w[-6].wq.next = (uv__queue *)((ulong)local_2020 & 0xffffffff);
        w[-6].wq.prev = local_2028;
        w[-5].work = (_func_void_uv__work_ptr *)((ulong)local_2020 >> 0x20);
        w[-5].done = (_func_void_uv__work_ptr_int *)(ulong)local_2018;
        w[-5].loop = local_2010;
        w[-5].wq.next = (uv__queue *)local_2038._8_8_;
        w[-5].wq.prev = local_2008;
        w[-4].work = (_func_void_uv__work_ptr *)local_2000.__val;
        w[-4].done = (_func_void_uv__work_ptr_int *)CONCAT44(uStack_1ff4,local_1ff8);
        w[-4].wq.prev = (uv__queue *)local_1ff0;
        w[-3].work = (_func_void_uv__work_ptr *)p_Stack_1fe8;
        w[-3].done = local_1fe0;
        w[-3].loop = puStack_1fd8;
        w[-3].wq.next = local_1fd0;
        w[-3].wq.prev = local_1fc8;
        w[-2].work = (_func_void_uv__work_ptr *)local_1fd0;
        w[-2].done = (_func_void_uv__work_ptr_int *)local_1fc8;
        w[-4].loop = (uv_loop_s *)0x0;
        w[-4].wq.next = (uv__queue *)0x0;
      }
      puVar14 = (uv__queue *)(long)iVar11;
      goto LAB_00152d1c;
    case 9:
      iVar5 = ftruncate64(*(int *)&w[-2].wq.next,(__off64_t)w[-1].done);
      break;
    case 10:
      puVar14 = w[-1].wq.next;
      lVar26 = (long)(double)puVar14;
      puVar14 = (uv__queue *)
                (((long)(((double)puVar14 - (double)lVar26) * 1000000000.0) / 1000) * 1000);
      local_2038._0_8_ = ((long)puVar14 >> 0x3f) + lVar26;
      local_2038._8_8_ = (uv__queue *)(long)((double)(long)puVar14 + 1000000000.0);
      if (-1 < (long)puVar14) {
        local_2038._8_8_ = puVar14;
      }
      puVar14 = w[-1].wq.prev;
      lVar26 = (long)(double)puVar14;
      pvVar15 = (void *)(((long)(((double)puVar14 - (double)lVar26) * 1000000000.0) / 1000) * 1000);
      local_2028 = (uv__queue *)(((long)pvVar15 >> 0x3f) + lVar26);
      local_2020 = (void *)(long)((double)(long)pvVar15 + 1000000000.0);
      if (-1 < (long)pvVar15) {
        local_2020 = pvVar15;
      }
      p_Var28 = w[-6].done;
      iVar5 = 0;
      goto LAB_00151ef1;
    case 0xb:
      puVar14 = w[-1].wq.next;
      lVar26 = (long)(double)puVar14;
      puVar14 = (uv__queue *)
                (((long)(((double)puVar14 - (double)lVar26) * 1000000000.0) / 1000) * 1000);
      local_2038._0_8_ = ((long)puVar14 >> 0x3f) + lVar26;
      local_2038._8_8_ = (uv__queue *)(long)((double)(long)puVar14 + 1000000000.0);
      if (-1 < (long)puVar14) {
        local_2038._8_8_ = puVar14;
      }
      puVar14 = w[-1].wq.prev;
      lVar26 = (long)(double)puVar14;
      pvVar15 = (void *)(((long)(((double)puVar14 - (double)lVar26) * 1000000000.0) / 1000) * 1000);
      local_2028 = (uv__queue *)(((long)pvVar15 >> 0x3f) + lVar26);
      local_2020 = (void *)(long)((double)(long)pvVar15 + 1000000000.0);
      if (-1 < (long)pvVar15) {
        local_2020 = pvVar15;
      }
      iVar5 = futimens(*(int *)&w[-2].wq.next,(timespec *)local_2038);
      break;
    case 0xc:
      iVar5 = access((char *)w[-6].done,*(int *)((long)&w[-2].wq.next + 4));
      break;
    case 0xd:
      iVar5 = chmod((char *)w[-6].done,*(__mode_t *)&w[-2].wq.prev);
      break;
    case 0xe:
      iVar5 = fchmod(*(int *)&w[-2].wq.next,*(__mode_t *)&w[-2].wq.prev);
      break;
    case 0xf:
      iVar5 = fsync(*(int *)&w[-2].wq.next);
      break;
    case 0x10:
      iVar5 = fdatasync(*(int *)&w[-2].wq.next);
      break;
    case 0x11:
      iVar5 = unlink((char *)w[-6].done);
      break;
    case 0x12:
      iVar5 = rmdir((char *)w[-6].done);
      break;
    case 0x13:
      iVar5 = mkdir((char *)w[-6].done,*(__mode_t *)&w[-2].wq.prev);
      break;
    case 0x14:
      pcVar22 = mkdtemp((char *)w[-6].done);
      puVar14 = (uv__queue *)-(ulong)(pcVar22 == (char *)0x0);
      goto LAB_00152d1c;
    case 0x15:
      iVar5 = rename((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x16:
      local_2038._0_8_ = (uv_loop_s *)0x0;
      iVar5 = scandir64((char *)w[-6].done,(dirent64 ***)local_2038,uv__fs_scandir_filter,
                        uv__fs_scandir_sort);
      *(undefined4 *)((long)&w[-2].wq.prev + 4) = 0;
      if (iVar5 == -1) {
        puVar14 = (uv__queue *)0xffffffffffffffff;
      }
      else {
        if (iVar5 == 0) {
          free((void *)local_2038._0_8_);
          local_2038._0_8_ = (uv_loop_s *)0x0;
        }
        w[-6].work = (_func_void_uv__work_ptr *)local_2038._0_8_;
        puVar14 = (uv__queue *)(long)iVar5;
      }
      goto LAB_00152d1c;
    case 0x17:
      iVar5 = link((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x18:
      iVar5 = symlink((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x19:
      sVar20 = pathconf((char *)w[-6].done,4);
      sVar31 = 0x1000;
      if (sVar20 != 0xffffffffffffffff) {
        sVar31 = sVar20;
      }
      p_Var17 = (_func_void_uv__work_ptr *)uv__malloc(sVar31);
      if (p_Var17 == (_func_void_uv__work_ptr *)0x0) {
        *puVar13 = 0xc;
      }
      else {
        sVar20 = readlink((char *)w[-6].done,(char *)p_Var17,sVar31);
        if (sVar20 != 0xffffffffffffffff) {
          if ((sVar20 != sVar31) ||
             (p_Var17 = (_func_void_uv__work_ptr *)uv__reallocf(p_Var17,sVar20 + 1),
             p_Var17 != (_func_void_uv__work_ptr *)0x0)) {
            p_Var17[sVar20] = (_func_void_uv__work_ptr)0x0;
            goto LAB_00152b48;
          }
          goto LAB_00152692;
        }
        uv__free(p_Var17);
      }
      puVar14 = (uv__queue *)0xffffffffffffffff;
      goto LAB_00152d1c;
    case 0x1a:
      iVar5 = chown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
      break;
    case 0x1b:
      iVar5 = fchown(*(int *)&w[-2].wq.next,*(__uid_t *)&w[-1].loop,
                     *(__gid_t *)((long)&w[-1].loop + 4));
      break;
    case 0x1c:
      p_Var17 = (_func_void_uv__work_ptr *)realpath((char *)w[-6].done,(char *)0x0);
      if (p_Var17 == (_func_void_uv__work_ptr *)0x0) {
        puVar14 = (uv__queue *)0xffffffffffffffff;
      }
      else {
LAB_00151b8d:
        w[-6].work = p_Var17;
        puVar14 = (uv__queue *)0x0;
      }
      goto LAB_00152d1c;
    case 0x1d:
      uVar9 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-6].done,0,0,(uv_fs_cb)0x0
                        );
      uv_fs_req_cleanup((uv_fs_t *)local_2038);
      if ((int)uVar9 < 0) {
        puVar14 = (uv__queue *)(long)(int)uVar9;
      }
      else {
        iVar5 = fstat64(uVar9,&local_20c8);
        __mode = local_20c8.st_mode;
        if (iVar5 == 0) {
          iVar11 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].loop,
                              (*(uint *)((long)&w[-2].wq.next + 4) & 1) << 7 | 0x41,
                              local_20c8.st_mode,(uv_fs_cb)0x0);
          uv_fs_req_cleanup((uv_fs_t *)local_2038);
          iVar5 = iVar11;
          if (-1 < iVar11) {
            if (((ulong)w[-2].wq.next & 0x100000000) == 0) {
              iVar5 = fstat64(iVar11,&local_2158);
              if (iVar5 == 0) {
                if ((((_func_void_uv__work_ptr_int *)
                      CONCAT26(local_20c8.st_dev._6_2_,
                               CONCAT24(local_20c8.st_dev._4_2_,(int)local_20c8.st_dev)) ==
                      (_func_void_uv__work_ptr_int *)local_2158.st_dev) &&
                    (iVar5 = 0, local_20c8.st_ino == local_2158.st_ino)) ||
                   ((iVar5 = ftruncate64(iVar11,0), iVar5 != 0 &&
                    ((iVar5 = -*puVar13, *puVar13 != 0xd || (0 < local_2158.st_size))))))
                goto LAB_00152e40;
                goto LAB_00152a52;
              }
LAB_00152da7:
              iVar5 = -*puVar13;
            }
            else {
LAB_00152a52:
              iVar5 = fchmod(iVar11,__mode);
              if (iVar5 == -1) {
                if (*puVar13 == 1) {
                  iVar5 = uv__is_cifs_or_smb(iVar11);
                  if (iVar5 != 0) goto LAB_00152a66;
                  iVar5 = -1;
                }
                else {
                  iVar5 = -*puVar13;
                }
              }
              else {
LAB_00152a66:
                if (((ulong)w[-2].wq.next & 0x600000000) != 0) {
                  iVar5 = 0;
                  iVar10 = ioctl(iVar11,0x40049409,(ulong)uVar9);
                  if (iVar10 == 0) goto LAB_00152e40;
                  if (((ulong)w[-2].wq.next & 0x400000000) != 0) goto LAB_00152da7;
                }
                p_Var28 = (_func_void_uv__work_ptr_int *)0x0;
                for (sVar31 = local_20c8.st_size; sVar31 != 0; sVar31 = sVar31 - (long)p_Var4) {
                  local_2038._8_4_ = 6;
                  local_1ff8 = UV_FS_SENDFILE;
                  local_1f28 = (char *)0x0;
                  local_1f10 = (uv_buf_t *)0x0;
                  local_1fd0 = (uv__queue *)0x0;
                  local_1fe0 = (_func_void_uv__work_ptr_int *)0x0;
                  puStack_1fd8 = (uv_loop_s *)0x0;
                  local_1ff0 = (uv_loop_t *)0x0;
                  p_Stack_1fe8 = (uv_fs_cb)0x0;
                  local_1f20 = iVar11;
                  local_1f1c = uVar9;
                  local_1f08 = p_Var28;
                  local_1eb8 = sVar31;
                  uv__fs_work((uv__work *)(local_2038 + 0x150));
                  p_Var4 = local_1fe0;
                  uv_fs_req_cleanup((uv_fs_t *)local_2038);
                  if ((long)p_Var4 < 0) {
                    iVar5 = (int)p_Var4;
                    goto LAB_00152e40;
                  }
                  p_Var28 = p_Var28 + (long)p_Var4;
                }
                iVar5 = 0;
              }
            }
          }
        }
        else {
          iVar11 = -1;
          iVar5 = -*puVar13;
        }
LAB_00152e40:
        iVar10 = 0;
        if (iVar5 < 0) {
          iVar10 = iVar5;
        }
        iVar12 = uv__close_nocheckstdio(uVar9);
        if (iVar12 == 0) {
          iVar12 = iVar10;
        }
        if (iVar5 < 0) {
          iVar12 = iVar10;
        }
        if (-1 < iVar11) {
          iVar5 = uv__close_nocheckstdio(iVar11);
          if (iVar5 == 0) {
            iVar5 = iVar12;
          }
          if (iVar12 != 0) {
            iVar5 = iVar12;
          }
          iVar12 = 0;
          if (iVar5 != 0) {
            uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].loop,(uv_fs_cb)0x0);
            uv_fs_req_cleanup((uv_fs_t *)local_2038);
            iVar12 = iVar5;
          }
        }
        if (iVar12 == 0) {
          puVar14 = (uv__queue *)0x0;
        }
        else {
          *puVar13 = -iVar12;
          puVar14 = (uv__queue *)0xffffffffffffffff;
        }
      }
      goto LAB_00152d1c;
    case 0x1e:
      iVar5 = lchown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4))
      ;
      break;
    case 0x1f:
      p_Var17 = (_func_void_uv__work_ptr *)uv__malloc(0x38);
      if (p_Var17 != (_func_void_uv__work_ptr *)0x0) {
        pDVar23 = opendir((char *)w[-6].done);
        *(DIR **)(p_Var17 + 0x30) = pDVar23;
        if (pDVar23 != (DIR *)0x0) {
LAB_00152b48:
          w[-6].work = p_Var17;
          goto LAB_00152b4f;
        }
      }
      uv__free(p_Var17);
      w[-6].work = (_func_void_uv__work_ptr *)0x0;
LAB_00152692:
      puVar14 = (uv__queue *)0xffffffffffffffff;
      goto LAB_00152d1c;
    case 0x20:
      p_Var17 = w[-6].work;
      if (*(long *)(p_Var17 + 8) == 0) {
        uVar9 = 0;
      }
      else {
        uVar30 = 0;
LAB_00152286:
        do {
          *puVar13 = 0;
          dent = readdir64(*(DIR **)(p_Var17 + 0x30));
          uVar9 = (uint)uVar30;
          if (dent == (dirent64 *)0x0) {
            if (*puVar13 != 0) {
LAB_00152876:
              if (uVar9 != 0) {
                lVar26 = 0;
                do {
                  uv__free(*(void **)(*(long *)p_Var17 + lVar26));
                  *(undefined8 *)(*(long *)p_Var17 + lVar26) = 0;
                  lVar26 = lVar26 + 0x10;
                } while (uVar30 << 4 != lVar26);
              }
              uVar9 = 0xffffffff;
            }
            break;
          }
          pcVar22 = dent->d_name;
          iVar5 = strcmp(pcVar22,".");
          if ((iVar5 == 0) || (iVar5 = strcmp(pcVar22,".."), iVar5 == 0)) {
            if (*(ulong *)(p_Var17 + 8) <= uVar30) break;
            goto LAB_00152286;
          }
          lVar26 = *(long *)p_Var17;
          pcVar22 = uv__strdup(pcVar22);
          *(char **)(lVar26 + uVar30 * 0x10) = pcVar22;
          if (pcVar22 == (char *)0x0) goto LAB_00152876;
          uVar8 = uv__fs_get_dirent_type((uv__dirent_t *)dent);
          *(uv_dirent_type_t *)(lVar26 + uVar30 * 0x10 + 8) = uVar8;
          uVar9 = uVar9 + 1;
          uVar30 = (ulong)uVar9;
        } while (uVar30 < *(ulong *)(p_Var17 + 8));
      }
      puVar14 = (uv__queue *)(long)(int)uVar9;
      goto LAB_00152d1c;
    case 0x21:
      p_Var17 = w[-6].work;
      pDVar23 = *(DIR **)(p_Var17 + 0x30);
      if (pDVar23 != (DIR *)0x0) {
        closedir(pDVar23);
        *(undefined8 *)(p_Var17 + 0x30) = 0;
      }
      uv__free(w[-6].work);
      w[-6].work = (_func_void_uv__work_ptr *)0x0;
LAB_00152b4f:
      puVar14 = (uv__queue *)0x0;
      goto LAB_00152d1c;
    case 0x22:
      iVar5 = statfs64((char *)w[-6].done,(statfs64 *)local_2038);
      puVar14 = (uv__queue *)0xffffffffffffffff;
      if (iVar5 == 0) {
        p_Var17 = (_func_void_uv__work_ptr *)uv__malloc(0x58);
        if (p_Var17 != (_func_void_uv__work_ptr *)0x0) {
          *(undefined8 *)p_Var17 = local_2038._0_8_;
          *(undefined8 *)(p_Var17 + 8) = local_2038._8_8_;
          *(uv__queue **)(p_Var17 + 0x10) = local_2028;
          *(void **)(p_Var17 + 0x18) = local_2020;
          *(long *)(p_Var17 + 0x20) = CONCAT44(iStack_2014,local_2018);
          *(uv_loop_s **)(p_Var17 + 0x28) = local_2010;
          *(uv__queue **)(p_Var17 + 0x30) = local_2008;
          goto LAB_00151b8d;
        }
        *puVar13 = 0xc;
      }
      goto LAB_00152d1c;
    case 0x23:
      p_Var28 = w[-6].done;
      sVar16 = strlen((char *)p_Var28);
      if ((sVar16 < 6) || (iVar5 = strcmp((char *)(p_Var28 + (sVar16 - 6)),"XXXXXX"), iVar5 != 0)) {
        *puVar13 = 0x16;
        iVar5 = -1;
LAB_00151ad5:
        if (iVar5 < 0) {
          *p_Var28 = (_func_void_uv__work_ptr_int)0x0;
        }
      }
      else {
        uv_once(&uv__fs_mkstemp_once,uv__mkostemp_initonce);
        if (uv__mkostemp == (_func_int_char_ptr_int *)0x0 || uv__fs_mkstemp_no_cloexec_support != 0)
        {
LAB_00152bbb:
          if (w[-7].wq.next != (uv__queue *)0x0) {
            uv_rwlock_rdlock(&(w[-7].loop)->cloexec_lock);
          }
          iVar5 = mkstemp64((char *)p_Var28);
          if ((-1 < iVar5) && (iVar11 = uv__cloexec(iVar5,1), iVar11 != 0)) {
            iVar11 = uv__close(iVar5);
            iVar5 = -1;
            if (iVar11 != 0) {
switchD_00151964_default:
              abort();
            }
          }
          if (w[-7].wq.next != (uv__queue *)0x0) {
            uv_rwlock_rdunlock(&(w[-7].loop)->cloexec_lock);
          }
          goto LAB_00151ad5;
        }
        iVar5 = (*uv__mkostemp)((char *)p_Var28,0x80000);
        if (iVar5 < 0) {
          if (*puVar13 != 0x16) goto LAB_00151ad5;
          uv__fs_mkstemp_no_cloexec_support = 1;
          goto LAB_00152bbb;
        }
      }
      puVar14 = (uv__queue *)(long)iVar5;
      goto LAB_00152d1c;
    case 0x24:
      puVar14 = w[-1].wq.next;
      lVar26 = (long)(double)puVar14;
      puVar14 = (uv__queue *)
                (((long)(((double)puVar14 - (double)lVar26) * 1000000000.0) / 1000) * 1000);
      local_2038._0_8_ = ((long)puVar14 >> 0x3f) + lVar26;
      local_2038._8_8_ = (uv__queue *)(long)((double)(long)puVar14 + 1000000000.0);
      if (-1 < (long)puVar14) {
        local_2038._8_8_ = puVar14;
      }
      puVar14 = w[-1].wq.prev;
      lVar26 = (long)(double)puVar14;
      pvVar15 = (void *)(((long)(((double)puVar14 - (double)lVar26) * 1000000000.0) / 1000) * 1000);
      local_2028 = (uv__queue *)(((long)pvVar15 >> 0x3f) + lVar26);
      local_2020 = (void *)(long)((double)(long)pvVar15 + 1000000000.0);
      if (-1 < (long)pvVar15) {
        local_2020 = pvVar15;
      }
      p_Var28 = w[-6].done;
      iVar5 = 0x100;
LAB_00151ef1:
      iVar5 = utimensat(-100,(char *)p_Var28,(timespec *)local_2038,iVar5);
      break;
    default:
      goto switchD_00151964_default;
    }
    puVar14 = (uv__queue *)(long)iVar5;
LAB_00152d1c:
    puVar21 = puVar14;
    if (puVar14 != (uv__queue *)0xffffffffffffffff) goto LAB_00152f1d;
  } while ((iVar1 - 4U < 0xfffffffe) && (*puVar13 == 4));
  puVar21 = (uv__queue *)-(long)(int)*puVar13;
LAB_00152f1d:
  w[-7].wq.prev = puVar21;
  if ((puVar14 == (uv__queue *)0x0) && (*(int *)&w[-7].done - 6U < 3)) {
    w[-6].work = (_func_void_uv__work_ptr *)buf;
  }
  return;
}

Assistant:

static void uv__fs_work(struct uv__work* w) {
  int retry_on_eintr;
  uv_fs_t* req;
  ssize_t r;

  req = container_of(w, uv_fs_t, work_req);
  retry_on_eintr = !(req->fs_type == UV_FS_CLOSE ||
                     req->fs_type == UV_FS_READ);

  do {
    errno = 0;

#define X(type, action)                                                       \
  case UV_FS_ ## type:                                                        \
    r = action;                                                               \
    break;

    switch (req->fs_type) {
    X(ACCESS, access(req->path, req->flags));
    X(CHMOD, chmod(req->path, req->mode));
    X(CHOWN, chown(req->path, req->uid, req->gid));
    X(CLOSE, uv__fs_close(req->file));
    X(COPYFILE, uv__fs_copyfile(req));
    X(FCHMOD, fchmod(req->file, req->mode));
    X(FCHOWN, fchown(req->file, req->uid, req->gid));
    X(LCHOWN, lchown(req->path, req->uid, req->gid));
    X(FDATASYNC, uv__fs_fdatasync(req));
    X(FSTAT, uv__fs_fstat(req->file, &req->statbuf));
    X(FSYNC, uv__fs_fsync(req));
    X(FTRUNCATE, ftruncate(req->file, req->off));
    X(FUTIME, uv__fs_futime(req));
    X(LUTIME, uv__fs_lutime(req));
    X(LSTAT, uv__fs_lstat(req->path, &req->statbuf));
    X(LINK, link(req->path, req->new_path));
    X(MKDIR, mkdir(req->path, req->mode));
    X(MKDTEMP, uv__fs_mkdtemp(req));
    X(MKSTEMP, uv__fs_mkstemp(req));
    X(OPEN, uv__fs_open(req));
    X(READ, uv__fs_read(req));
    X(SCANDIR, uv__fs_scandir(req));
    X(OPENDIR, uv__fs_opendir(req));
    X(READDIR, uv__fs_readdir(req));
    X(CLOSEDIR, uv__fs_closedir(req));
    X(READLINK, uv__fs_readlink(req));
    X(REALPATH, uv__fs_realpath(req));
    X(RENAME, rename(req->path, req->new_path));
    X(RMDIR, rmdir(req->path));
    X(SENDFILE, uv__fs_sendfile(req));
    X(STAT, uv__fs_stat(req->path, &req->statbuf));
    X(STATFS, uv__fs_statfs(req));
    X(SYMLINK, symlink(req->path, req->new_path));
    X(UNLINK, unlink(req->path));
    X(UTIME, uv__fs_utime(req));
    X(WRITE, uv__fs_write_all(req));
    default: abort();
    }
#undef X
  } while (r == -1 && errno == EINTR && retry_on_eintr);

  if (r == -1)
    req->result = UV__ERR(errno);
  else
    req->result = r;

  if (r == 0 && (req->fs_type == UV_FS_STAT ||
                 req->fs_type == UV_FS_FSTAT ||
                 req->fs_type == UV_FS_LSTAT)) {
    req->ptr = &req->statbuf;
  }
}